

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

Expression * __thiscall
CFG::MultipleShape::Render(MultipleShape *this,RelooperBuilder *Builder,bool InLoop)

{
  long *plVar1;
  If *this_00;
  Shape *pSVar2;
  bool bVar3;
  int iVar4;
  Binary *condition;
  Expression *ifTrue;
  size_type sVar5;
  reference ppIVar6;
  Block *Ret_00;
  undefined4 extraout_var;
  Block *local_a0;
  Expression *Ret;
  If *curr;
  If *local_80;
  If *Now;
  type *Body;
  type *Id;
  _Self local_60;
  iterator __end1;
  iterator __begin1;
  IdShapeMap *__range1;
  vector<wasm::If_*,_std::allocator<wasm::If_*>_> finalizeStack;
  If *CurrIf;
  If *FirstIf;
  bool InLoop_local;
  RelooperBuilder *Builder_local;
  MultipleShape *this_local;
  
  CurrIf = (If *)0x0;
  finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::vector
            ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&__range1);
  __end1 = std::
           map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
           ::begin(&this->InnerMap);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<int,_CFG::Shape_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG::Shape_*>_>_>
       ::end(&this->InnerMap);
  while (bVar3 = std::operator!=(&__end1,&local_60), bVar3) {
    Id = &std::_Rb_tree_iterator<std::pair<const_int,_CFG::Shape_*>_>::operator*(&__end1)->first;
    Body = (type *)std::get<0ul,int_const,CFG::Shape*>((pair<const_int,_CFG::Shape_*> *)Id);
    Now = (If *)std::get<1ul,int_const,CFG::Shape*>((pair<const_int,_CFG::Shape_*> *)Id);
    condition = RelooperBuilder::makeCheckLabel(Builder,*(Index *)Body);
    plVar1 = *(long **)&(Now->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression;
    ifTrue = (Expression *)(**(code **)(*plVar1 + 0x10))(plVar1,Builder,InLoop);
    local_80 = ::wasm::Builder::makeIf
                         (&Builder->super_Builder,(Expression *)condition,ifTrue,(Expression *)0x0);
    std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::push_back
              ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&__range1,&local_80);
    if (finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      CurrIf = local_80;
    }
    else {
      finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[4] = local_80;
      ::wasm::If::finalize
                ((If *)finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    finalizeStack.super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_80;
    std::_Rb_tree_iterator<std::pair<const_int,_CFG::Shape_*>_>::operator++(&__end1);
  }
  while (sVar5 = std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::size
                           ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&__range1),
        sVar5 != 0) {
    ppIVar6 = std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::back
                        ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&__range1);
    this_00 = *ppIVar6;
    std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::pop_back
              ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&__range1);
    ::wasm::If::finalize(this_00);
  }
  Ret_00 = ::wasm::Builder::makeBlock(&Builder->super_Builder,(Expression *)CurrIf);
  local_a0 = (Block *)HandleFollowupMultiples
                                ((Expression *)Ret_00,&this->super_Shape,Builder,InLoop);
  if ((this->super_Shape).Next != (Shape *)0x0) {
    pSVar2 = (this->super_Shape).Next;
    iVar4 = (*pSVar2->_vptr_Shape[2])(pSVar2,Builder,(ulong)(InLoop & 1));
    local_a0 = ::wasm::Builder::makeSequence
                         (&Builder->super_Builder,(Expression *)local_a0,
                          (Expression *)CONCAT44(extraout_var,iVar4));
  }
  std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::~vector
            ((vector<wasm::If_*,_std::allocator<wasm::If_*>_> *)&__range1);
  return (Expression *)local_a0;
}

Assistant:

wasm::Expression* MultipleShape::Render(RelooperBuilder& Builder, bool InLoop) {
  // TODO: consider switch
  // emit an if-else chain
  wasm::If* FirstIf = nullptr;
  wasm::If* CurrIf = nullptr;
  std::vector<wasm::If*> finalizeStack;
  for (auto& [Id, Body] : InnerMap) {
    auto* Now =
      Builder.makeIf(Builder.makeCheckLabel(Id), Body->Render(Builder, InLoop));
    finalizeStack.push_back(Now);
    if (!CurrIf) {
      FirstIf = CurrIf = Now;
    } else {
      CurrIf->ifFalse = Now;
      CurrIf->finalize();
      CurrIf = Now;
    }
  }
  while (finalizeStack.size() > 0) {
    wasm::If* curr = finalizeStack.back();
    finalizeStack.pop_back();
    curr->finalize();
  }
  wasm::Expression* Ret = Builder.makeBlock(FirstIf);
  Ret = HandleFollowupMultiples(Ret, this, Builder, InLoop);
  if (Next) {
    Ret = Builder.makeSequence(Ret, Next->Render(Builder, InLoop));
  }
  return Ret;
}